

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.hpp
# Opt level: O2

void __thiscall hta::storage::file::Metric::Header::restore(Header *this,size_t read_bytes)

{
  if (read_bytes != 0x38) {
    throw_exception<hta::Exception,char_const*,unsigned_long,char_const*,unsigned_long>
              ("Unexpected header size ",read_bytes,", expected ",0x38);
  }
  if (this->version == 2) {
    if (((this->duration_period).num == 1) && ((this->duration_period).den == 1000000000)) {
      return;
    }
    throw_exception<hta::Exception,char_const*>("Unsupported HTA chrono duration period.");
  }
  throw_exception<hta::Exception,char_const*,unsigned_long,char_const*>
            ("Unsupported HTA file format version ",this->version,", supported 2");
}

Assistant:

void restore(size_t read_bytes)
        {
            if (read_bytes != sizeof(Header))
            {
                throw_exception("Unexpected header size ", read_bytes, ", expected ",
                                sizeof(Header));
            }
            // For now we don't support different versions
            if (version != 2)
            {
                throw_exception("Unsupported HTA file format version ", version, ", supported 2");
            }
            if (duration_period.num != Duration::period::num ||
                duration_period.den != Duration::period::den)
            {
                throw_exception("Unsupported HTA chrono duration period.");
            }
        }